

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RenameToken * renameColumnTokenNext(RenameCtx *pCtx)

{
  RenameCtx *local_28;
  RenameToken **pp;
  RenameToken *pToken;
  RenameToken *pBest;
  RenameCtx *pCtx_local;
  
  pToken = pCtx->pList;
  for (pp = (RenameToken **)pToken->pNext; local_28 = pCtx, pp != (RenameToken **)0x0;
      pp = (RenameToken **)pp[3]) {
    if ((RenameToken *)(pToken->t).z < pp[1]) {
      pToken = (RenameToken *)pp;
    }
  }
  for (; local_28->pList != pToken; local_28 = (RenameCtx *)&local_28->pList->pNext) {
  }
  local_28->pList = pToken->pNext;
  return pToken;
}

Assistant:

static RenameToken *renameColumnTokenNext(RenameCtx *pCtx){
  RenameToken *pBest = pCtx->pList;
  RenameToken *pToken;
  RenameToken **pp;

  for(pToken=pBest->pNext; pToken; pToken=pToken->pNext){
    if( pToken->t.z>pBest->t.z ) pBest = pToken;
  }
  for(pp=&pCtx->pList; *pp!=pBest; pp=&(*pp)->pNext);
  *pp = pBest->pNext;

  return pBest;
}